

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
::rebalance_right_to_left
          (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
           *this,int to_move,
          btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  size_type sVar1;
  undefined8 *puVar2;
  bool bVar3;
  undefined8 uVar4;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  bVar5;
  long lVar6;
  btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
  *pbVar7;
  char *__function;
  size_type i;
  long lVar8;
  size_type sVar9;
  ulong uVar10;
  
  if ((((ulong)this & 7) == 0) && (((ulong)right & 7) == 0)) {
    uVar10 = *(ulong *)this;
    if (uVar10 != *(ulong *)right) {
      __assert_fail("parent() == right->parent()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x87f,
                    "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                   );
    }
    if ((byte)this[8] + 1 != (uint)(byte)right[8]) {
      __assert_fail("position() + 1 == right->position()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x880,
                    "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                   );
    }
    bVar5 = this[10];
    if ((byte)right[10] < (byte)bVar5) {
      __assert_fail("right->count() >= count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x881,
                    "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                   );
    }
    if (to_move < 1) {
      __assert_fail("to_move >= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x882,
                    "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                   );
    }
    if ((int)(uint)(byte)right[10] < to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x883,
                    "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                   );
    }
    if ((uVar10 & 7) == 0) {
      puVar2 = (undefined8 *)(uVar10 + 0xc + (ulong)(byte)this[8] * 0x10);
      uVar4 = puVar2[1];
      *(undefined8 *)(this + (ulong)(byte)bVar5 * 0x10 + 0xc) = *puVar2;
      *(undefined8 *)(this + (ulong)(byte)bVar5 * 0x10 + 0xc + 8) = uVar4;
      uninitialized_move_n(right,(ulong)(to_move - 1),0,(ulong)(byte)bVar5 + 1,this,alloc);
      uVar10 = *(ulong *)this;
      if ((uVar10 & 7) == 0) {
        lVar8 = (ulong)(to_move - 1) * 0x10;
        lVar6 = (ulong)(byte)this[8] * 0x10;
        *(undefined4 *)(uVar10 + 0xc + lVar6) = *(undefined4 *)(right + lVar8 + 0xc);
        *(undefined4 *)(uVar10 + 0x10 + lVar6) = *(undefined4 *)(right + lVar8 + 0x10);
        *(undefined4 *)(uVar10 + 0x14 + lVar6) = *(undefined4 *)(right + lVar8 + 0x14);
        *(undefined4 *)(uVar10 + 0x18 + lVar6) = *(undefined4 *)(right + lVar8 + 0x18);
        uVar10 = (ulong)(uint)to_move;
        if (uVar10 != (byte)right[10]) {
          pbVar7 = right + 0x18;
          lVar8 = uVar10 * 0x10;
          lVar6 = (ulong)(byte)right[10] << 4;
          do {
            *(undefined4 *)(pbVar7 + -0xc) = *(undefined4 *)(pbVar7 + lVar8 + -0xc);
            *(undefined4 *)(pbVar7 + -8) = *(undefined4 *)(pbVar7 + lVar8 + -8);
            *(undefined4 *)(pbVar7 + -4) = *(undefined4 *)(pbVar7 + lVar8 + -4);
            *(undefined4 *)pbVar7 = *(undefined4 *)(pbVar7 + lVar8);
            pbVar7 = pbVar7 + 0x10;
            lVar6 = lVar6 + -0x10;
          } while (lVar8 != lVar6);
        }
        if (this[0xb] ==
            (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
             )0x0) {
          sVar9 = 1;
          if (1 < to_move) {
            sVar9 = (ulong)(uint)to_move;
          }
          i = 0;
          do {
            bVar5 = this[10];
            sVar1 = i + 1;
            pbVar7 = child(right,i);
            init_child(this,(int)i + (uint)(byte)bVar5 + 1,pbVar7);
            i = sVar1;
          } while (sVar9 != sVar1);
          if (to_move <= (int)(uint)(byte)right[10]) {
            lVar6 = 0;
            do {
              sVar9 = uVar10 + lVar6;
              bVar5 = right[0xb];
              if (right[0xb] ==
                  (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                   )0x0) {
                bVar5 = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                         )0xf;
              }
              if ((int)(uint)(byte)bVar5 < (int)sVar9) {
                __assert_fail("i + to_move <= right->max_count()",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0x89c,
                              "void phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>]"
                             );
              }
              pbVar7 = child(right,sVar9);
              init_child(right,(int)lVar6,pbVar7);
              mutable_child(right,sVar9);
              bVar3 = lVar6 < (long)((ulong)(byte)right[10] - (long)to_move);
              lVar6 = lVar6 + 1;
            } while (bVar3);
          }
        }
        this[10] = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                    )((char)this[10] + (char)to_move);
        right[10] = (btree_node<phmap::priv::map_params<std::pair<int,_int>,_std::pair<int,_int>,_phmap::Less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_256,_false>_>
                     )((char)right[10] - (char)to_move);
        return;
      }
    }
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
    ;
  }
  else {
    __function = 
    "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::pair<int, int>, std::pair<int, int>>, phmap::priv::btree_node<phmap::priv::map_params<std::pair<int, int>, std::pair<int, int>, phmap::Less<std::pair<int, int>>, std::allocator<std::pair<const std::pair<int, int>, std::pair<int, int>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 0UL, Char = const char]"
    ;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,__function);
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                                btree_node *right,
                                                allocator_type *alloc) {
        assert(parent() == right->parent());
        assert(position() + 1 == right->position());
        assert(right->count() >= count());
        assert(to_move >= 1);
        assert(to_move <= right->count());

        // 1) Move the delimiting value in the parent to the left node.
        value_init(count(), alloc, parent()->slot(position()));

        // 2) Move the (to_move - 1) values from the right node to the left node.
        right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

        // 3) Move the new delimiting value to the parent from the right node.
        params_type::move(alloc, right->slot(to_move - 1),
                          parent()->slot(position()));

        // 4) Shift the values in the right node to their correct position.
        params_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                          right->slot(0));

        // 5) Destroy the now-empty to_move entries in the right node.
        right->value_destroy_n(right->count() - to_move, to_move, alloc);

        if (!leaf()) {
            // Move the child pointers from the right to the left node.
            for (int i = 0; i < to_move; ++i) {
                init_child(count() + i + 1, right->child(i));
            }
            for (int i = 0; i <= right->count() - to_move; ++i) {
                assert(i + to_move <= right->max_count());
                right->init_child(i, right->child(i + to_move));
                right->clear_child(i + to_move);
            }
        }

        // Fixup the counts on the left and right nodes.
        set_count((field_type)(count() + to_move));
        right->set_count((field_type)(right->count() - to_move));
    }